

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_connective.c
# Opt level: O0

void send_setup(void)

{
  _class *c;
  t_symbol *ptVar1;
  
  ptVar1 = gensym("send");
  send_class = class_new(ptVar1,send_new,(t_method)0x0,0x38,0,A_DEFSYM,0);
  ptVar1 = gensym("s");
  class_addcreator(send_new,ptVar1,A_DEFSYM,0);
  class_addbang(send_class,send_bang);
  class_doaddfloat(send_class,send_float);
  class_addsymbol(send_class,send_symbol);
  class_addpointer(send_class,send_pointer);
  class_addlist(send_class,send_list);
  class_addanything(send_class,send_anything);
  c = send_class;
  ptVar1 = gensym("send-receive");
  class_sethelpsymbol(c,ptVar1);
  return;
}

Assistant:

static void send_setup(void)
{
    send_class = class_new(gensym("send"), (t_newmethod)send_new, 0,
        sizeof(t_send), 0, A_DEFSYM, 0);
    class_addcreator((t_newmethod)send_new, gensym("s"), A_DEFSYM, 0);
    class_addbang(send_class, send_bang);
    class_addfloat(send_class, send_float);
    class_addsymbol(send_class, send_symbol);
    class_addpointer(send_class, send_pointer);
    class_addlist(send_class, send_list);
    class_addanything(send_class, send_anything);
    class_sethelpsymbol(send_class, gensym("send-receive"));
}